

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

vector<UniValue,_std::allocator<UniValue>_> * __thiscall
ArgsManager::GetSettingsList(ArgsManager *this,string *arg)

{
  long lVar1;
  string *name;
  long in_RSI;
  vector<UniValue,_std::allocator<UniValue>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  ArgsManager *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffa8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(int)((ulong)in_RSI >> 0x20),
             SUB81((ulong)in_RSI >> 0x18,0));
  name = (string *)(in_RSI + 0x100);
  SettingName((string *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  UseDefaultSection(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  common::GetSettingsList
            ((Settings *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,name,
             (bool)in_stack_ffffffffffffffdf);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<common::SettingsValue> ArgsManager::GetSettingsList(const std::string& arg) const
{
    LOCK(cs_args);
    return common::GetSettingsList(m_settings, m_network, SettingName(arg), !UseDefaultSection(arg));
}